

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::reactor_op>::~op_queue
          (op_queue<boost::asio::detail::reactor_op> *this)

{
  noncopyable *in_RDI;
  reactor_op *op;
  
  while (*(op_queue<boost::asio::detail::reactor_op> **)in_RDI !=
         (op_queue<boost::asio::detail::reactor_op> *)0x0) {
    pop(*(op_queue<boost::asio::detail::reactor_op> **)in_RDI);
    op_queue_access::destroy<boost::asio::detail::reactor_op>((reactor_op *)0x12ce8b);
  }
  noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }